

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall kj::anon_unknown_31::WebSocketPipeImpl::~WebSocketPipeImpl(WebSocketPipeImpl *this)

{
  bool bVar1;
  WebSocket *pWVar2;
  bool bVar3;
  Fault local_28;
  Fault f;
  WebSocketPipeImpl *this_local;
  
  bVar1 = Maybe<kj::WebSocket_&>::operator==(&this->state,(void *)0x0);
  bVar3 = true;
  if (!bVar1) {
    pWVar2 = Own<kj::WebSocket>::get(&this->ownState);
    bVar3 = pWVar2 != (WebSocket *)0x0;
  }
  if (!bVar3) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[86]>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0xa0a,FAILED,"state == nullptr || ownState.get() != nullptr",
               "\"destroying WebSocketPipe with operation still in-progress; probably going to segfault\""
               ,(char (*) [86])
                "destroying WebSocketPipe with operation still in-progress; probably going to segfault"
              );
    _::Debug::Fault::~Fault(&local_28);
  }
  Maybe<kj::ForkedPromise<void>_>::~Maybe(&this->abortedPromise);
  Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::~Maybe(&this->abortedFulfiller);
  Own<kj::WebSocket>::~Own(&this->ownState);
  Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

~WebSocketPipeImpl() noexcept(false) {
    KJ_REQUIRE(state == nullptr || ownState.get() != nullptr,
        "destroying WebSocketPipe with operation still in-progress; probably going to segfault") {
      // Don't std::terminate().
      break;
    }
  }